

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O3

void ssl_free_buffered_record(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_handshake_params *hs;
  
  if ((ssl != (mbedtls_ssl_context *)0x0) && (ssl[2].in_iv != (uchar *)0x0)) {
    ssl[2].session = (mbedtls_ssl_session *)((long)ssl[2].session - (long)ssl[2].in_msg);
    free(ssl[2].in_iv);
    ssl[2].in_iv = (uchar *)0x0;
  }
  return;
}

Assistant:

static void ssl_free_buffered_record(mbedtls_ssl_context *ssl)
{
    mbedtls_ssl_handshake_params * const hs = ssl->handshake;
    if (hs == NULL) {
        return;
    }

    if (hs->buffering.future_record.data != NULL) {
        hs->buffering.total_bytes_buffered -=
            hs->buffering.future_record.len;

        mbedtls_free(hs->buffering.future_record.data);
        hs->buffering.future_record.data = NULL;
    }
}